

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall net_tests::cnode_simple_test::test_method(cnode_simple_test *this)

{
  Network NVar1;
  CNode *pCVar2;
  iterator pvVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  shared_ptr<Sock> sock;
  shared_ptr<Sock> sock_00;
  shared_ptr<Sock> sock_01;
  shared_ptr<Sock> sock_02;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode4;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode3;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode2;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode1;
  in_addr ipv4Addr;
  string pszDest;
  CAddress addr;
  direct_or_indirect *pdVar5;
  undefined8 in_stack_fffffffffffff878;
  undefined4 uVar7;
  lazy_ostream *plVar6;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  _Head_base<0UL,_CNode_*,_false> local_5f8;
  undefined1 local_5ec [4];
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  _Head_base<0UL,_CNode_*,_false> local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  _Head_base<0UL,_CNode_*,_false> local_300;
  undefined1 local_2f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  _Head_base<0UL,_CNode_*,_false> local_160;
  in_addr local_154;
  _Head_base<0UL,_CNode_*,_false> *local_150;
  _Head_base<0UL,_CNode_*,_false> *local_148;
  char *local_140;
  char *local_138;
  assertion_result local_130;
  assertion_result local_118;
  _Head_base<0UL,_CNode_*,_false> **local_100;
  undefined1 local_f8;
  undefined1 local_f0 [24];
  element_type *local_d8;
  undefined8 local_c8;
  undefined8 local_c0;
  direct_or_indirect local_b8;
  char local_a8;
  undefined7 uStack_a7;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffff878 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_154.s_addr = 0xa0b0c001;
  CService::CService((CService *)&local_98.indirect_contents,&local_154,0x1e61);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  local_58 = local_80;
  local_50 = local_78;
  local_48 = 100000000;
  local_40 = 1;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  local_b8.indirect_contents.indirect = &local_a8;
  local_b8._8_8_ = 0;
  local_a8 = '\0';
  CService::CService((CService *)local_f0);
  local_c8 = 100000000;
  local_c0 = 0;
  pCVar2 = (CNode *)operator_new(0x3a8);
  local_2f8 = (undefined1  [8])0x0;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._0_8_ = (ulong)(uint)local_118._4_4_ << 0x20;
  local_118.m_message.pn.pi_ = local_118.m_message.pn.pi_ & 0xffffffffffffff00;
  local_118.m_message.px = (element_type *)0x0;
  local_100 = (_Head_base<0UL,_CNode_*,_false> **)0x4c4b40;
  local_f8 = 0;
  pdVar5 = &local_b8;
  pvVar3 = (iterator)0x0;
  pvVar4 = (iterator)0x0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_2f8;
  CNode::CNode(pCVar2,0,sock,(CAddress *)0x0,0,(uint64_t)local_f0,
               (CAddress *)&pdVar5->indirect_contents,(string *)CONCAT44(uVar7,1),INBOUND,
               SUB81(&local_118,0),
               (CNodeOptions *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  local_160._M_head_impl = pCVar2;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_118.m_message);
  if (p_Stack_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2f0);
  }
  if (0x10 < (uint)local_f0._16_4_) {
    free((void *)local_f0._0_8_);
    local_f0._0_8_ = (char *)0x0;
  }
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x47;
  file.m_begin = (iterator)&local_170;
  msg.m_end = pvVar4;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_180,msg);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd817;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd83b;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_188 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((local_160._M_head_impl)->m_conn_type == OUTBOUND_FULL_RELAY);
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_190,0x47
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x48;
  file_00.m_begin = (iterator)&local_1a0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_160._M_head_impl)->m_conn_type != MANUAL);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd83c;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd85b;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_1c0,0x48
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x49;
  file_01.m_begin = (iterator)&local_1d0;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_160._M_head_impl)->m_conn_type != BLOCK_RELAY);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd85c;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd87e;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_1f0,0x49
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4a;
  file_02.m_begin = (iterator)&local_200;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_210,
             msg_02);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_160._M_head_impl)->m_conn_type != FEELER);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd87f;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd89e;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_218 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_220,0x4a
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4b;
  file_03.m_begin = (iterator)&local_230;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_160._M_head_impl)->m_conn_type != ADDR_FETCH);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd89f;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd8c1;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_248 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_250,0x4b
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4c;
  file_04.m_begin = (iterator)&local_260;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_270,
             msg_04);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_160._M_head_impl)->m_conn_type != INBOUND);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd8c2;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd8e2;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_278 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_280,0x4c
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4d;
  file_05.m_begin = (iterator)&local_290;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2a0,
             msg_05);
  local_118._0_8_ = CONCAT71(local_118._1_7_,(local_160._M_head_impl)->m_inbound_onion) ^ 1;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd8e3;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd903;
  plVar6 = (lazy_ostream *)local_f0;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_2a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,plVar6,1,0,WARN,(check_type)pdVar5,(size_t)&local_2b0,0x4d);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4e;
  file_06.m_begin = (iterator)&local_2c0;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2d0,
             msg_06);
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)p_Stack_2f0 & 0xffffffffffffff00);
  local_2f8 = (undefined1  [8])&PTR__lazy_ostream_013d3cb0;
  local_2e8 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = "";
  local_300._M_head_impl._0_4_ = CNode::ConnectedThroughNetwork(local_160._M_head_impl);
  local_148 = &local_300;
  local_150 = &local_478;
  local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Network)local_300._M_head_impl == NET_IPV4);
  local_478._M_head_impl._0_4_ = 1;
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_138 = "";
  local_d8 = (element_type *)&local_148;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d6388;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_150;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013d6388;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)local_2f8,1,2,REQUIRE,0xedd904,(size_t)&local_140,0x4e,
             plVar6,"Network::NET_IPV4",&local_118);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  CService::CService((CService *)local_f0);
  local_c8 = 100000000;
  local_c0 = 0;
  pCVar2 = (CNode *)operator_new(0x3a8);
  local_2f8 = (undefined1  [8])0x0;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._0_8_ = local_118._0_8_ & 0xffffffff00000000;
  local_118.m_message.pn.pi_ = local_118.m_message.pn.pi_ & 0xffffffffffffff00;
  local_118.m_message.px = (element_type *)0x0;
  local_100 = (_Head_base<0UL,_CNode_*,_false> **)0x4c4b40;
  local_f8 = 0;
  pdVar5 = &local_b8;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70;
  sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_2f8;
  CNode::CNode(pCVar2,1,sock_00,(CAddress *)0x1,1,(uint64_t)local_f0,
               (CAddress *)&pdVar5->indirect_contents,(string *)((ulong)plVar6 & 0xffffffff00000000)
               ,INBOUND,SUB81(&local_118,0),
               (CNodeOptions *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  local_300._M_head_impl = pCVar2;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_118.m_message);
  if (p_Stack_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2f0);
  }
  if (0x10 < (uint)local_f0._16_4_) {
    free((void *)local_f0._0_8_);
    local_f0._0_8_ = (undefined **)0x0;
  }
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x59;
  file_07.m_begin = (iterator)&local_310;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_320,
             msg_07);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd938;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd95d;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_328 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((local_300._M_head_impl)->m_conn_type != OUTBOUND_FULL_RELAY);
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_330,0x59
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x5a;
  file_08.m_begin = (iterator)&local_340;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_350,
             msg_08);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_300._M_head_impl)->m_conn_type != MANUAL);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd95e;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd97d;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_358 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_360,0x5a
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x5b;
  file_09.m_begin = (iterator)&local_370;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_380,
             msg_09);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_300._M_head_impl)->m_conn_type != BLOCK_RELAY);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd97e;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd9a0;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_388 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_390,0x5b
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x5c;
  file_10.m_begin = (iterator)&local_3a0;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3b0,
             msg_10);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_300._M_head_impl)->m_conn_type != FEELER);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd9a1;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd9c0;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_3c0,0x5c
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x5d;
  file_11.m_begin = (iterator)&local_3d0;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3e0,
             msg_11);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_300._M_head_impl)->m_conn_type != ADDR_FETCH);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd9c1;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedd9e3;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_3f0,0x5d
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x5e;
  file_12.m_begin = (iterator)&local_400;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_410,
             msg_12);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_300._M_head_impl)->m_conn_type == INBOUND);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedd9e4;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedda03;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_418 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_420,0x5e
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x5f;
  file_13.m_begin = (iterator)&local_430;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_440,
             msg_13);
  local_118._0_8_ = CONCAT71(local_118._1_7_,(local_300._M_head_impl)->m_inbound_onion) ^ 1;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedda04;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedda24;
  plVar6 = (lazy_ostream *)local_f0;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_448 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,plVar6,1,0,WARN,(check_type)pdVar5,(size_t)&local_450,0x5f);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x60;
  file_14.m_begin = (iterator)&local_460;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_470,
             msg_14);
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)p_Stack_2f0 & 0xffffffffffffff00);
  local_2f8 = (undefined1  [8])&PTR__lazy_ostream_013d3cb0;
  local_2e8 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = "";
  NVar1 = CNode::ConnectedThroughNetwork(local_300._M_head_impl);
  local_478._M_head_impl._0_4_ = NVar1;
  local_150 = &local_5f8;
  local_5f8._M_head_impl._0_4_ = 1;
  local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_IPV4);
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_138 = "";
  local_148 = &local_478;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d6388;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (element_type *)&local_148;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013d6388;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)local_2f8,1,2,REQUIRE,0xedda25,(size_t)&local_140,0x60,
             plVar6,"Network::NET_IPV4",&local_118);
  uVar7 = (undefined4)((ulong)plVar6 >> 0x20);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  CService::CService((CService *)local_f0);
  local_c8 = 100000000;
  local_c0 = 0;
  pCVar2 = (CNode *)operator_new(0x3a8);
  local_2f8 = (undefined1  [8])0x0;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._0_8_ = local_118._0_8_ & 0xffffffff00000000;
  local_118.m_message.pn.pi_ = local_118.m_message.pn.pi_ & 0xffffffffffffff00;
  local_118.m_message.px = (element_type *)0x0;
  local_100 = (_Head_base<0UL,_CNode_*,_false> **)0x4c4b40;
  local_f8 = 0;
  pdVar5 = &local_b8;
  pvVar3 = (iterator)0x0;
  pvVar4 = (iterator)0x0;
  sock_01.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70;
  sock_01.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_2f8;
  CNode::CNode(pCVar2,2,sock_01,(CAddress *)0x0,0,(uint64_t)local_f0,
               (CAddress *)&pdVar5->indirect_contents,(string *)CONCAT44(uVar7,1),INBOUND,
               SUB81(&local_118,0),
               (CNodeOptions *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  local_478._M_head_impl = pCVar2;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_118.m_message);
  if (p_Stack_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2f0);
  }
  if (0x10 < (uint)local_f0._16_4_) {
    free((void *)local_f0._0_8_);
    local_f0._0_8_ = (undefined **)0x0;
  }
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x6b;
  file_15.m_begin = (iterator)&local_488;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_498,
             msg_15);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedda47;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedda6b;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4a0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((local_478._M_head_impl)->m_conn_type == OUTBOUND_FULL_RELAY);
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_4a8,0x6b
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x6c;
  file_16.m_begin = (iterator)&local_4b8;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4c8,
             msg_16);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_478._M_head_impl)->m_conn_type != MANUAL);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedda6c;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xedda8b;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4d0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_4d8,0x6c
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x6d;
  file_17.m_begin = (iterator)&local_4e8;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4f8,
             msg_17);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_478._M_head_impl)->m_conn_type != BLOCK_RELAY);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xedda8c;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddaae;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_500 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_508,0x6d
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x6e;
  file_18.m_begin = (iterator)&local_518;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_528,
             msg_18);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_478._M_head_impl)->m_conn_type != FEELER);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddaaf;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddace;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_530 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_538,0x6e
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x6f;
  file_19.m_begin = (iterator)&local_548;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_558,
             msg_19);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_478._M_head_impl)->m_conn_type != ADDR_FETCH);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddacf;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddaf1;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_560 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_568,0x6f
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x70;
  file_20.m_begin = (iterator)&local_578;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_588,
             msg_20);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_478._M_head_impl)->m_conn_type != INBOUND);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddaf2;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddb12;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_590 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_598,0x70
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x71;
  file_21.m_begin = (iterator)&local_5a8;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5b8,
             msg_21);
  local_118._0_8_ = CONCAT71(local_118._1_7_,(local_478._M_head_impl)->m_inbound_onion) ^ 1;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddb13;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddb33;
  plVar6 = (lazy_ostream *)local_f0;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_5c0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,plVar6,1,0,WARN,(check_type)pdVar5,(size_t)&local_5c8,0x71);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x72;
  file_22.m_begin = (iterator)&local_5d8;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5e8,
             msg_22);
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)p_Stack_2f0 & 0xffffffffffffff00);
  local_2f8 = (undefined1  [8])&PTR__lazy_ostream_013d3cb0;
  local_2e8 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = "";
  NVar1 = CNode::ConnectedThroughNetwork(local_478._M_head_impl);
  local_5f8._M_head_impl._0_4_ = NVar1;
  local_150 = (_Head_base<0UL,_CNode_*,_false> *)local_5ec;
  local_5ec = (undefined1  [4])0x1;
  local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(NVar1 == NET_IPV4);
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_138 = "";
  local_148 = &local_5f8;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d6388;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (element_type *)&local_148;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013d6388;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)local_2f8,1,2,REQUIRE,0xeddb34,(size_t)&local_140,0x72,
             plVar6,"Network::NET_IPV4",&local_118);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  CService::CService((CService *)local_f0);
  local_c8 = 100000000;
  local_c0 = 0;
  pCVar2 = (CNode *)operator_new(0x3a8);
  local_2f8 = (undefined1  [8])0x0;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._0_8_ = local_118._0_8_ & 0xffffffff00000000;
  local_118.m_message.pn.pi_ = local_118.m_message.pn.pi_ & 0xffffffffffffff00;
  local_118.m_message.px = (element_type *)0x0;
  local_100 = (_Head_base<0UL,_CNode_*,_false> **)0x4c4b40;
  local_f8 = 0;
  pdVar5 = &local_b8;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x1;
  sock_02.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70;
  sock_02.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_2f8;
  CNode::CNode(pCVar2,3,sock_02,(CAddress *)0x1,1,(uint64_t)local_f0,
               (CAddress *)&pdVar5->indirect_contents,(string *)((ulong)plVar6 & 0xffffffff00000000)
               ,OUTBOUND_FULL_RELAY,SUB81(&local_118,0),
               (CNodeOptions *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  local_5f8._M_head_impl = pCVar2;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_118.m_message);
  if (p_Stack_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2f0);
  }
  if (0x10 < (uint)local_f0._16_4_) {
    free((void *)local_f0._0_8_);
    local_f0._0_8_ = (undefined **)0x0;
  }
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x7d;
  file_23.m_begin = (iterator)&local_608;
  msg_23.m_end = pvVar4;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_618,
             msg_23);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddb56;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddb7b;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_620 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((local_5f8._M_head_impl)->m_conn_type != OUTBOUND_FULL_RELAY);
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_628,0x7d
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x7e;
  file_24.m_begin = (iterator)&local_638;
  msg_24.m_end = pvVar4;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_648,
             msg_24);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_5f8._M_head_impl)->m_conn_type != MANUAL);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddb7c;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddb9b;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_650 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_658,0x7e
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x7f;
  file_25.m_begin = (iterator)&local_668;
  msg_25.m_end = pvVar4;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_678,
             msg_25);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_5f8._M_head_impl)->m_conn_type != BLOCK_RELAY);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddb9c;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddbbe;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_680 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_688,0x7f
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_690 = "";
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x80;
  file_26.m_begin = (iterator)&local_698;
  msg_26.m_end = pvVar4;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6a8,
             msg_26);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_5f8._M_head_impl)->m_conn_type != FEELER);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddbbf;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddbde;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6b0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_6b8,0x80
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x81;
  file_27.m_begin = (iterator)&local_6c8;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6d8,
             msg_27);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_5f8._M_head_impl)->m_conn_type != ADDR_FETCH);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddbdf;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddc01;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6e0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_6e8,0x81
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6f0 = "";
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x82;
  file_28.m_begin = (iterator)&local_6f8;
  msg_28.m_end = pvVar4;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_708,
             msg_28);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_5f8._M_head_impl)->m_conn_type == INBOUND);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddc02;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddc21;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_710 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_718,0x82
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x83;
  file_29.m_begin = (iterator)&local_728;
  msg_29.m_end = pvVar4;
  msg_29.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_738,
             msg_29);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_5f8._M_head_impl)->m_inbound_onion;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2f8 = (undefined1  [8])0xeddc22;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeddc41;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_740 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d8 = (element_type *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pdVar5,(size_t)&local_748,0x83
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x84;
  file_30.m_begin = (iterator)&local_758;
  msg_30.m_end = pvVar4;
  msg_30.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_768,
             msg_30);
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)p_Stack_2f0 & 0xffffffffffffff00);
  local_2f8 = (undefined1  [8])&PTR__lazy_ostream_013d3cb0;
  local_2e8 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = "";
  local_5ec = (undefined1  [4])CNode::ConnectedThroughNetwork(local_5f8._M_head_impl);
  local_150 = (_Head_base<0UL,_CNode_*,_false> *)&stack0xfffffffffffff894;
  local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_5ec == (undefined1  [4])0x3);
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_138 = "";
  local_148 = (_Head_base<0UL,_CNode_*,_false> *)local_5ec;
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_013d6388;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_d8 = (element_type *)&local_148;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013d6388;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)local_2f8,1,2,REQUIRE,0xeddc42,(size_t)&local_140,0x84,
             (lazy_ostream *)local_f0,"Network::NET_ONION",&local_118);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)&local_5f8);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)&local_478);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)&local_300);
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr
            ((unique_ptr<CNode,_std::default_delete<CNode>_> *)&local_160);
  if (local_b8.indirect_contents.indirect != &local_a8) {
    operator_delete(local_b8.indirect_contents.indirect,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if (0x10 < local_60) {
    free(local_70.indirect_contents.indirect);
    local_70.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnode_simple_test)
{
    NodeId id = 0;

    in_addr ipv4Addr;
    ipv4Addr.s_addr = 0xa0b0c001;

    CAddress addr = CAddress(CService(ipv4Addr, 7777), NODE_NETWORK);
    std::string pszDest;

    std::unique_ptr<CNode> pnode1 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/0,
                                                            /*nLocalHostNonceIn=*/0,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::OUTBOUND_FULL_RELAY,
                                                            /*inbound_onion=*/false);
    BOOST_CHECK(pnode1->IsFullOutboundConn() == true);
    BOOST_CHECK(pnode1->IsManualConn() == false);
    BOOST_CHECK(pnode1->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode1->IsFeelerConn() == false);
    BOOST_CHECK(pnode1->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode1->IsInboundConn() == false);
    BOOST_CHECK(pnode1->m_inbound_onion == false);
    BOOST_CHECK_EQUAL(pnode1->ConnectedThroughNetwork(), Network::NET_IPV4);

    std::unique_ptr<CNode> pnode2 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/1,
                                                            /*nLocalHostNonceIn=*/1,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::INBOUND,
                                                            /*inbound_onion=*/false);
    BOOST_CHECK(pnode2->IsFullOutboundConn() == false);
    BOOST_CHECK(pnode2->IsManualConn() == false);
    BOOST_CHECK(pnode2->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode2->IsFeelerConn() == false);
    BOOST_CHECK(pnode2->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode2->IsInboundConn() == true);
    BOOST_CHECK(pnode2->m_inbound_onion == false);
    BOOST_CHECK_EQUAL(pnode2->ConnectedThroughNetwork(), Network::NET_IPV4);

    std::unique_ptr<CNode> pnode3 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/0,
                                                            /*nLocalHostNonceIn=*/0,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::OUTBOUND_FULL_RELAY,
                                                            /*inbound_onion=*/false);
    BOOST_CHECK(pnode3->IsFullOutboundConn() == true);
    BOOST_CHECK(pnode3->IsManualConn() == false);
    BOOST_CHECK(pnode3->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode3->IsFeelerConn() == false);
    BOOST_CHECK(pnode3->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode3->IsInboundConn() == false);
    BOOST_CHECK(pnode3->m_inbound_onion == false);
    BOOST_CHECK_EQUAL(pnode3->ConnectedThroughNetwork(), Network::NET_IPV4);

    std::unique_ptr<CNode> pnode4 = std::make_unique<CNode>(id++,
                                                            /*sock=*/nullptr,
                                                            addr,
                                                            /*nKeyedNetGroupIn=*/1,
                                                            /*nLocalHostNonceIn=*/1,
                                                            CAddress(),
                                                            pszDest,
                                                            ConnectionType::INBOUND,
                                                            /*inbound_onion=*/true);
    BOOST_CHECK(pnode4->IsFullOutboundConn() == false);
    BOOST_CHECK(pnode4->IsManualConn() == false);
    BOOST_CHECK(pnode4->IsBlockOnlyConn() == false);
    BOOST_CHECK(pnode4->IsFeelerConn() == false);
    BOOST_CHECK(pnode4->IsAddrFetchConn() == false);
    BOOST_CHECK(pnode4->IsInboundConn() == true);
    BOOST_CHECK(pnode4->m_inbound_onion == true);
    BOOST_CHECK_EQUAL(pnode4->ConnectedThroughNetwork(), Network::NET_ONION);
}